

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O3

void read_numbered_sentence_pair
               (string *line,vector<int,_std::allocator<int>_> *s,Dict *sd,
               vector<int,_std::allocator<int>_> *t,Dict *td,
               vector<int,_std::allocator<int>_> *identifiers)

{
  pointer piVar1;
  iterator iVar2;
  _Alloc_hider __nptr;
  int iVar3;
  istream *piVar4;
  long lVar5;
  Dict *this;
  vector<int,_std::allocator<int>_> *this_00;
  string word;
  string sep;
  istringstream in;
  int local_204;
  vector<int,_std::allocator<int>_> *local_200;
  Dict *local_1f8;
  string local_1f0;
  undefined1 *local_1d0;
  size_t local_1c8;
  undefined1 local_1c0 [16];
  long local_1b0 [4];
  byte abStack_190 [88];
  ios_base local_138 [264];
  
  local_200 = t;
  local_1f8 = td;
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)line,_S_in);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1d0 = local_1c0;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"|||","");
  lVar5 = *(long *)(local_1b0[0] + -0x18);
  if ((abStack_190[lVar5] & 5) == 0) {
    piVar1 = (identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
        ._M_finish != piVar1) {
      (identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = piVar1;
    }
    while( true ) {
      piVar4 = std::operator>>((istream *)local_1b0,(string *)&local_1f0);
      __nptr._M_p = local_1f0._M_dataplus._M_p;
      lVar5 = *(long *)(local_1b0[0] + -0x18);
      if ((((((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) ||
           ((abStack_190[lVar5] & 5) != 0)) || (local_1f0._M_string_length == 0)) ||
         ((local_1f0._M_string_length == local_1c8 &&
          (iVar3 = bcmp(local_1f0._M_dataplus._M_p,local_1d0,local_1f0._M_string_length), iVar3 == 0
          )))) break;
      local_204 = atoi(__nptr._M_p);
      iVar2._M_current =
           (identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(identifiers,iVar2,&local_204)
        ;
      }
      else {
        *iVar2._M_current = local_204;
        (identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
        ._M_finish = iVar2._M_current + 1;
      }
    }
  }
  if ((abStack_190[lVar5] & 5) == 0) {
    do {
      do {
        this_00 = s;
        this = sd;
        std::operator>>((istream *)local_1b0,(string *)&local_1f0);
        if ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) != 0) goto LAB_001248b1;
      } while ((local_1f0._M_string_length == local_1c8) &&
              ((sd = local_1f8, s = local_200, local_1f0._M_string_length == 0 ||
               (iVar3 = bcmp(local_1f0._M_dataplus._M_p,local_1d0,local_1f0._M_string_length),
               sd = local_1f8, s = local_200, iVar3 == 0))));
      local_204 = dynet::Dict::convert(this,&local_1f0);
      iVar2._M_current =
           (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar2._M_current ==
          (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar2,&local_204);
      }
      else {
        *iVar2._M_current = local_204;
        (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      sd = this;
      s = this_00;
    } while ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) == 0);
  }
LAB_001248b1:
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void read_numbered_sentence_pair(const std::string& line, std::vector<int>* s, Dict* sd, std::vector<int>* t, Dict* td, vector<int> &identifiers) 
{
    std::istringstream in(line);
    std::string word;
    std::string sep = "|||";
    Dict* d = sd;
    std::vector<int>* v = s; 

    if (in) {
        identifiers.clear();
        while (in >> word) {
            if (!in || word.empty()) break;
            if (word == sep) break;
            identifiers.push_back(atoi(word.c_str()));
        }
    }

    while(in) {
        in >> word;
        if (!in) break;
        if (word == sep) { d = td; v = t; continue; }
        v->push_back(d->convert(word));
    }
}